

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O0

bool tao::pegtl::internal::
     duseltronik<tao::pegtl::plus<tao::pegtl::ascii::digit>,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_data_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)1>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *st,ovf_segment *st_1,float **st_2)

{
  bool bVar1;
  float **st_local_2;
  ovf_segment *st_local_1;
  ovf_file *st_local;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_local;
  
  normal<tao::pegtl::plus<tao::pegtl::ascii::digit>>::
  start<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
            (in,st,st_1,st_2);
  bVar1 = duseltronik<tao::pegtl::plus<tao::pegtl::ascii::digit>,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_data_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)0>
          ::
          match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
                    (in,st,st_1,st_2);
  if (bVar1) {
    normal<tao::pegtl::plus<tao::pegtl::ascii::digit>>::
    success<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
              (in,st,st_1,st_2);
  }
  else {
    normal<tao::pegtl::plus<tao::pegtl::ascii::digit>>::
    failure<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
              (in,st,st_1,st_2);
  }
  return bVar1;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, M, Action, Control, dusel_mode::nothing >::match( in, st... ) ) {
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return true;
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }